

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_close(linear_hash_table_t *linear_hash)

{
  int iVar1;
  linear_hash_table_t *linear_hash_local;
  
  iVar1 = fclose((FILE *)linear_hash->state);
  if (iVar1 == 0) {
    if (linear_hash->bucket_map->data != (ion_fpos_t *)0x0) {
      free(linear_hash->bucket_map->data);
      linear_hash->bucket_map->data = (ion_fpos_t *)0x0;
    }
    if (linear_hash->bucket_map != (array_list_t *)0x0) {
      free(linear_hash->bucket_map);
      linear_hash->bucket_map = (array_list_t *)0x0;
    }
    iVar1 = fclose((FILE *)linear_hash->database);
    if (iVar1 == 0) {
      if (linear_hash->cache != (ion_byte_t *)0x0) {
        free(linear_hash->cache);
        linear_hash->bucket_map = (array_list_t *)0x0;
      }
      linear_hash->database = (FILE *)0x0;
      linear_hash->state = (FILE *)0x0;
      linear_hash_local._7_1_ = '\0';
    }
    else {
      linear_hash_local._7_1_ = '\n';
    }
  }
  else {
    linear_hash_write_state(linear_hash);
    linear_hash_local._7_1_ = '\n';
  }
  return linear_hash_local._7_1_;
}

Assistant:

ion_err_t
linear_hash_close(
	linear_hash_table_t *linear_hash
) {
	if (0 != fclose(linear_hash->state)) {
		linear_hash_write_state(linear_hash);
		return err_file_close_error;
	}

	if (linear_hash->bucket_map->data != NULL) {
		free(linear_hash->bucket_map->data);
		linear_hash->bucket_map->data = NULL;
	}

	if (linear_hash->bucket_map != NULL) {
		free(linear_hash->bucket_map);
		linear_hash->bucket_map = NULL;
	}

	if (0 != fclose(linear_hash->database)) {
		return err_file_close_error;
	}

	if (linear_hash->cache != NULL) {
		free(linear_hash->cache);
		linear_hash->bucket_map = NULL;
	}

	linear_hash->database	= NULL;

	linear_hash->state		= NULL;

	return err_ok;
}